

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O2

void __thiscall
amrex::Amr::timeStep(Amr *this,int level,Real time,int iteration,int niter,Real stop_time)

{
  int *piVar1;
  double dVar2;
  uint uVar3;
  __uniq_ptr_data<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>,_true,_true> _Var4;
  pointer pdVar5;
  pointer piVar6;
  int iVar7;
  int iVar8;
  ostream *poVar9;
  Print *pPVar10;
  ulong uVar11;
  long lVar12;
  int old_finest_1;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  int old_finest;
  int iVar17;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  ostringstream *poVar21;
  bool bVar22;
  double dVar23;
  Print local_1b8;
  
  this->which_level_being_advanced = level;
  uVar18 = (ulong)level;
  *(undefined4 *)
   ((long)(this->amr_level).
          super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
          .
          super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar18]._M_t.
          super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> + 0x20c) = 0
  ;
  iVar8 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
  if ((iVar8 == 0) && ((anonymous_namespace)::regrid_on_restart != 0)) {
    (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0x10])(this);
  }
  else {
    iVar17 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
    iVar19 = iVar8 + -1;
    if (iVar17 <= iVar8 + -1) {
      iVar19 = iVar17;
    }
    for (uVar14 = uVar18; iVar13 = (int)uVar14, iVar13 <= iVar19; uVar14 = uVar14 + 1) {
      bVar22 = okToRegrid(this,iVar13);
      if (bVar22) {
        (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[7])(time,this,uVar14 & 0xffffffff,0);
        if ((iVar13 == 0) && (compute_new_dt_on_regrid != 0)) {
          _Var4.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
          super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
          super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
               (((this->amr_level).
                 super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_t).
               super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
          (**(code **)(*(long *)_Var4.
                                super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x70
                      ))(stop_time,
                         _Var4.
                         super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                         .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,
                         *(undefined4 *)
                          &(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c,
                         this->sub_cycle,&this->n_cycle,
                         &(this->super_AmrCore).super_AmrMesh.super_AmrInfo.ref_ratio,&this->dt_min,
                         &this->dt_level,1);
        }
        piVar6 = (this->level_count).super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        uVar11 = uVar14;
        while( true ) {
          iVar8 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
          if ((long)iVar8 < (long)uVar11) break;
          piVar6[uVar11] = 0;
          uVar11 = uVar11 + 1;
        }
        if (iVar17 < iVar8) {
          pdVar5 = (this->dt_level).super_vector<double,_std::allocator<double>_>.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar6 = (this->n_cycle).super_vector<int,_std::allocator<int>_>.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          for (lVar12 = (long)iVar17; lVar12 < iVar8; lVar12 = lVar12 + 1) {
            pdVar5[lVar12 + 1] = pdVar5[lVar12] / (double)piVar6[lVar12 + 1];
          }
        }
      }
      iVar8 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
      iVar13 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
      iVar7 = iVar8 + -1;
      if (iVar13 <= iVar8 + -1) {
        iVar7 = iVar13;
      }
      if (iVar13 < iVar17) {
        iVar19 = iVar7;
      }
      iVar17 = iVar13;
    }
    if ((((iVar8 == 0) && (0 < this->loadbalance_level0_int)) &&
        (this->loadbalance_with_workestimates != 0)) &&
       ((*(this->level_steps).super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start ==
         1 || (this->loadbalance_level0_int <=
               *(this->level_count).super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start)))) {
      LoadBalanceLevel0(this,time);
      *(this->level_count).super_vector<int,_std::allocator<int>_>.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start = 0;
    }
  }
  if (((anonymous_namespace)::plotfile_on_restart != 0) &&
     ((this->restart_chkfile)._M_string_length != 0)) {
    (anonymous_namespace)::plotfile_on_restart = 0;
    (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0xd])(this);
  }
  if (0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose) {
    poVar9 = OutStream();
    Print::Print(&local_1b8,poVar9);
    poVar21 = &local_1b8.ss;
    std::operator<<((ostream *)poVar21,"[Level ");
    std::ostream::operator<<(poVar21,level);
    std::operator<<((ostream *)poVar21," step ");
    std::ostream::operator<<
              (poVar21,(this->level_steps).super_vector<int,_std::allocator<int>_>.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[uVar18] + 1);
    std::operator<<((ostream *)poVar21,"] ");
    std::operator<<((ostream *)poVar21,"ADVANCE with dt = ");
    pPVar10 = Print::operator<<(&local_1b8,
                                (this->dt_level).super_vector<double,_std::allocator<double>_>.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start + uVar18);
    std::operator<<((ostream *)&pPVar10->ss,"\n");
    Print::~Print(&local_1b8);
  }
  _Var4.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
  super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
  super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
       (this->amr_level).
       super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
       .
       super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[uVar18]._M_t.
       super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
  dVar23 = (double)(**(code **)(*(long *)_Var4.
                                         super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                         .super__Head_base<0UL,_amrex::AmrLevel_*,_false>.
                                         _M_head_impl + 0x78))
                             (time,(this->dt_level).super_vector<double,_std::allocator<double>_>.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start[uVar18],
                              _Var4.
                              super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                              .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,
                              iteration,niter);
  pdVar5 = (this->dt_min).super_vector<double,_std::allocator<double>_>.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if ((iteration != 1) && (dVar2 = pdVar5[uVar18], dVar2 <= dVar23)) {
    dVar23 = dVar2;
  }
  pdVar5[uVar18] = dVar23;
  piVar1 = (this->level_steps).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start +
           uVar18;
  *piVar1 = *piVar1 + 1;
  piVar1 = (this->level_count).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start +
           uVar18;
  *piVar1 = *piVar1 + 1;
  if (0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose) {
    poVar9 = OutStream();
    Print::Print(&local_1b8,poVar9);
    poVar21 = &local_1b8.ss;
    std::operator<<((ostream *)poVar21,"[Level ");
    std::ostream::operator<<(poVar21,level);
    std::operator<<((ostream *)poVar21," step ");
    pPVar10 = Print::operator<<(&local_1b8,
                                (this->level_steps).super_vector<int,_std::allocator<int>_>.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start + uVar18);
    poVar21 = &pPVar10->ss;
    std::operator<<((ostream *)poVar21,"] ");
    std::operator<<((ostream *)poVar21,"Advanced ");
    AmrLevel::countCells
              ((AmrLevel *)
               (this->amr_level).
               super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar18]._M_t.
               super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>);
    std::ostream::_M_insert<long>((long)poVar21);
    std::operator<<((ostream *)poVar21," cells\n");
    Print::~Print(&local_1b8);
  }
  iVar8 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
  iVar17 = iVar8;
  if (*(int *)((long)(this->amr_level).
                     super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                     .
                     super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar18]._M_t.
                     super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> +
              0x20c) != 0) {
    (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[7])(time,this,(ulong)(uint)level,0);
    iVar17 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
    if (iVar8 < iVar17) {
      pdVar5 = (this->dt_level).super_vector<double,_std::allocator<double>_>.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      piVar6 = (this->n_cycle).super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      for (lVar12 = (long)iVar8; lVar12 < iVar17; lVar12 = lVar12 + 1) {
        pdVar5[lVar12 + 1] = pdVar5[lVar12] / (double)piVar6[lVar12 + 1];
      }
    }
  }
  if (level < iVar17) {
    uVar15 = level + 1;
    if (this->sub_cycle == 0) {
      (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0x11])
                (time,stop_time,this,(ulong)uVar15,1);
    }
    else {
      uVar3 = (this->n_cycle).super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [(int)uVar15];
      uVar16 = 0;
      if (0 < (int)uVar3) {
        uVar16 = uVar3;
      }
      uVar20 = 1;
      while (bVar22 = uVar16 != 0, uVar16 = uVar16 - 1, bVar22) {
        (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0x11])
                  ((double)(int)(uVar20 - 1) *
                   (this->dt_level).super_vector<double,_std::allocator<double>_>.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[(int)uVar15] + time,stop_time,this,(ulong)uVar15
                   ,(ulong)uVar20,(ulong)uVar3);
        uVar20 = uVar20 + 1;
      }
    }
  }
  _Var4.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
  super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
  super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
       (this->amr_level).
       super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
       .
       super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[uVar18]._M_t.
       super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
  (**(code **)(*(long *)_Var4.
                        super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                        .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x80))
            (_Var4.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
             _M_t.super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
             super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,iteration);
  this->which_level_being_advanced = -1;
  return;
}

Assistant:

void
Amr::timeStep (int  level,
               Real time,
               int  iteration,
               int  niter,
               Real stop_time)
{
    BL_PROFILE("Amr::timeStep()");
    BL_COMM_PROFILE_NAMETAG("Amr::timeStep TOP");

    // This is used so that the AmrLevel functions can know which level is being advanced
    //      when regridding is called with possible lbase > level.
    which_level_being_advanced = level;


    // Update so that by default, we don't force a post-step regrid.
    amr_level[level]->setPostStepRegrid(0);

    //
    // Allow regridding of level 0 calculation on restart.
    //
    if (max_level == 0 && regrid_on_restart)
    {
        regrid_level_0_on_restart();
    }
    else
    {
        int lev_top = std::min(finest_level, max_level-1);
        for (int i(level); i <= lev_top; ++i)
        {
            const int old_finest = finest_level;

            if (okToRegrid(i))
            {
                regrid(i,time);

                //
                // Compute new dt after regrid if at level 0 and compute_new_dt_on_regrid.
                //
                if ( compute_new_dt_on_regrid && (i == 0) )
                {
                    int post_regrid_flag = 1;
                    amr_level[0]->computeNewDt(finest_level,
                                               sub_cycle,
                                               n_cycle,
                                               ref_ratio,
                                               dt_min,
                                               dt_level,
                                               stop_time,
                                               post_regrid_flag);
                }

                for (int k(i); k <= finest_level; ++k) {
                    level_count[k] = 0;
                }

                if (old_finest < finest_level)
                {
                    //
                    // The new levels will not have valid time steps
                    // and iteration counts.
                    //
                    for (int k(old_finest + 1); k <= finest_level; ++k)
                    {
                        dt_level[k]    = dt_level[k-1]/n_cycle[k];
                    }
                }
            }
            if (old_finest > finest_level) {
                lev_top = std::min(finest_level, max_level - 1);
            }
        }

        if (max_level == 0 && loadbalance_level0_int > 0 && loadbalance_with_workestimates)
        {
            if (level_steps[0] == 1 || level_count[0] >= loadbalance_level0_int) {
                LoadBalanceLevel0(time);
                level_count[0] = 0;
            }
        }
    }
    //
    // Check to see if should write plotfile.
    // This routine is here so it is done after the restart regrid.
    //
    if (plotfile_on_restart && ! (restart_chkfile.empty()) )
    {
        plotfile_on_restart = 0;
        writePlotFile();
    }
    //
    // Advance grids at this level.
    //
    if (verbose > 0)
    {
        amrex::Print() << "[Level " << level << " step " << level_steps[level]+1 << "] "
                       << "ADVANCE with dt = " << dt_level[level] << "\n";
    }

    Real dt_new = amr_level[level]->advance(time,dt_level[level],iteration,niter);
    BL_PROFILE_REGION_STOP("amr_level.advance");

    dt_min[level] = iteration == 1 ? dt_new : std::min(dt_min[level],dt_new);

    level_steps[level]++;
    level_count[level]++;

    if (verbose > 0)
    {
        amrex::Print() << "[Level " << level << " step " << level_steps[level] << "] "
                       << "Advanced " << amr_level[level]->countCells() << " cells\n";
    }

    // If the level signified that it wants a regrid after the advance has
    // occurred, do that now.
    if (amr_level[level]->postStepRegrid()) {

        int old_finest = finest_level;

        regrid(level, time);

        if (old_finest < finest_level)
        {
            //
            // The new levels will not have valid time steps.
            //
            for (int k = old_finest + 1; k <= finest_level; ++k)
            {
                dt_level[k] = dt_level[k-1] / n_cycle[k];
            }
        }
    }

    //
    // Advance grids at higher level.
    //
    if (level < finest_level)
    {
        const int lev_fine = level+1;

        if (sub_cycle)
        {
            const int ncycle = n_cycle[lev_fine];

            BL_COMM_PROFILE_NAMETAG("Amr::timeStep timeStep subcycle");
            for (int i = 1; i <= ncycle; i++)
                timeStep(lev_fine,time+(i-1)*dt_level[lev_fine],i,ncycle,stop_time);
        }
        else
        {
            BL_COMM_PROFILE_NAMETAG("Amr::timeStep timeStep nosubcycle");
            timeStep(lev_fine,time,1,1,stop_time);
        }
    }

    amr_level[level]->post_timestep(iteration);

    // Set this back to negative so we know whether we are in fact in this routine
    which_level_being_advanced = -1;
}